

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O0

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
findPosition(HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
             *this,KeyType *key,u8 *meta,u64 *startPos,u64 *maxPos,u64 *pos)

{
  u8 uVar1;
  bool bVar2;
  u64 hash_00;
  u64 uVar3;
  pointer pHVar4;
  type puVar5;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *pHVar6;
  ulong *in_RCX;
  u8 *in_RDX;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  u64 currentDistance;
  Entry *entryArray;
  u64 hash;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *in_stack_ffffffffffffff88;
  HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  *in_stack_ffffffffffffff90;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *in_stack_ffffffffffffffa0;
  ulong uVar7;
  
  hash_00 = HighsHashHelpers::
            hash<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_0>
                      (in_stack_ffffffffffffffa0);
  *in_RCX = hash_00 >> ((byte)in_RDI->numHashShift & 0x3f);
  uVar7 = *in_RCX;
  uVar3 = maxDistance();
  *in_R8 = uVar7 + uVar3 & in_RDI->tableSizeMask;
  uVar1 = toMetadata(in_RDI,hash_00);
  *in_RDX = uVar1;
  pHVar4 = std::
           unique_ptr<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>,_HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::OpNewDeleter>
           ::get(&in_stack_ffffffffffffff90->entries);
  *in_R9 = *in_RCX;
  while( true ) {
    puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    bVar2 = occupied(in_RDI,*puVar5);
    if (!bVar2) {
      return false;
    }
    puVar5 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator[]
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                        in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88);
    if (*puVar5 == *in_RDX) {
      HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
      ::key(pHVar4 + *in_R9);
      bVar2 = HighsHashHelpers::
              equal<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_0>
                        ((pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)
                         in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      if (bVar2) {
        return true;
      }
    }
    in_stack_ffffffffffffff90 =
         (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int> *
         )(*in_R9 - *in_RCX & in_RDI->tableSizeMask);
    pHVar6 = (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
              *)distanceFromIdealSlot(in_stack_ffffffffffffff90,(u64)in_stack_ffffffffffffff88);
    if (pHVar6 < in_stack_ffffffffffffff90) break;
    *in_R9 = *in_R9 + 1 & in_RDI->tableSizeMask;
    if (*in_R9 == *in_R8) {
      return false;
    }
  }
  return false;
}

Assistant:

bool findPosition(const KeyType& key, u8& meta, u64& startPos, u64& maxPos,
                    u64& pos) const {
    u64 hash = HighsHashHelpers::hash(key);
    startPos = hash >> numHashShift;
    maxPos = (startPos + maxDistance()) & tableSizeMask;
    meta = toMetadata(hash);

    const Entry* entryArray = entries.get();
    pos = startPos;
    do {
      if (!occupied(metadata[pos])) return false;
      if (metadata[pos] == meta &&
          HighsHashHelpers::equal(key, entryArray[pos].key()))
        return true;

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      if (currentDistance > distanceFromIdealSlot(pos)) return false;

      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    return false;
  }